

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O1

void __thiscall SubprocessSet::SubprocessSet(SubprocessSet *this)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  sigaction act;
  sigset_t set;
  sigaction local_130;
  sigset_t local_98;
  
  (this->finished_).c.super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->finished_).c.super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->finished_).c.super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->finished_).c.super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->finished_).c.super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->finished_).c.super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->finished_).c.super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->finished_).c.super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->finished_).c.super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->finished_).c.super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>::_M_initialize_map
            ((_Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_> *)&this->finished_,0);
  sigemptyset(&local_98);
  sigaddset(&local_98,2);
  sigaddset(&local_98,0xf);
  sigaddset(&local_98,1);
  iVar1 = sigprocmask(0,&local_98,(sigset_t *)&this->old_mask_);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    Fatal("sigprocmask: %s",pcVar3);
  }
  memset(&local_130,0,0x98);
  local_130.__sigaction_handler.sa_handler = SetInterruptedFlag;
  iVar1 = sigaction(2,&local_130,(sigaction *)&this->old_int_act_);
  if (-1 < iVar1) {
    iVar1 = sigaction(0xf,&local_130,(sigaction *)&this->old_term_act_);
    if (-1 < iVar1) {
      iVar1 = sigaction(1,&local_130,(sigaction *)&this->old_hup_act_);
      if (-1 < iVar1) {
        return;
      }
    }
  }
  piVar2 = __errno_location();
  pcVar3 = strerror(*piVar2);
  Fatal("sigaction: %s",pcVar3);
}

Assistant:

SubprocessSet::SubprocessSet() {
  sigset_t set;
  sigemptyset(&set);
  sigaddset(&set, SIGINT);
  sigaddset(&set, SIGTERM);
  sigaddset(&set, SIGHUP);
  if (sigprocmask(SIG_BLOCK, &set, &old_mask_) < 0)
    Fatal("sigprocmask: %s", strerror(errno));

  struct sigaction act;
  memset(&act, 0, sizeof(act));
  act.sa_handler = SetInterruptedFlag;
  if (sigaction(SIGINT, &act, &old_int_act_) < 0)
    Fatal("sigaction: %s", strerror(errno));
  if (sigaction(SIGTERM, &act, &old_term_act_) < 0)
    Fatal("sigaction: %s", strerror(errno));
  if (sigaction(SIGHUP, &act, &old_hup_act_) < 0)
    Fatal("sigaction: %s", strerror(errno));
}